

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O3

parser_error parse_player_timed_on_begin_effect(parser *p)

{
  long *plVar1;
  parser_error pVar2;
  long *plVar3;
  effect *effect;
  
  plVar3 = (long *)parser_priv(p);
  if (plVar3 == (long *)0x0) {
    __assert_fail("ps",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                  ,0x1b1,"enum parser_error parse_player_timed_on_begin_effect(struct parser *)");
  }
  if (*plVar3 == 0) {
    return PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  effect = (effect *)mem_zalloc(0x38);
  plVar3[1] = (long)effect;
  plVar1 = *(long **)(*plVar3 + 0x48);
  if (plVar1 == (long *)0x0) {
    plVar3 = (long *)(*plVar3 + 0x48);
  }
  else {
    do {
      plVar3 = plVar1;
      plVar1 = (long *)*plVar3;
    } while ((long *)*plVar3 != (long *)0x0);
  }
  *plVar3 = (long)effect;
  pVar2 = grab_effect_data(p,effect);
  return pVar2;
}

Assistant:

static enum parser_error parse_player_timed_on_begin_effect(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	struct effect *effect;

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* Go to the next vacant effect and set it to the new one. */
	ps->e = mem_zalloc(sizeof(*effect));
	if (ps->t->on_begin_effect) {
		effect = ps->t->on_begin_effect;
		while (effect->next) effect = effect->next;
		effect->next = ps->e;
	} else {
		ps->t->on_begin_effect = ps->e;
	}
	/* Fill in the details. */
	return grab_effect_data(p, ps->e);
}